

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi_Buffer.cpp
# Opt level: O0

void __thiscall Stereo_Buffer::end_frame(Stereo_Buffer *this,blip_time_t clock_count)

{
  int iVar1;
  blip_time_t in_ESI;
  long in_RDI;
  uint i;
  undefined4 local_10;
  
  *(undefined4 *)(in_RDI + 0xf8) = 0;
  for (local_10 = 0; local_10 < 3; local_10 = local_10 + 1) {
    iVar1 = Blip_Buffer::clear_modified((Blip_Buffer *)(in_RDI + 0x20 + (ulong)local_10 * 0x40));
    *(uint *)(in_RDI + 0xf8) = iVar1 << ((byte)local_10 & 0x1f) | *(uint *)(in_RDI + 0xf8);
    Blip_Buffer::end_frame((Blip_Buffer *)(in_RDI + 0x20 + (ulong)local_10 * 0x40),in_ESI);
  }
  return;
}

Assistant:

void Stereo_Buffer::end_frame( blip_time_t clock_count )
{
	stereo_added = 0;
	for ( unsigned i = 0; i < buf_count; i++ )
	{
		stereo_added |= bufs [i].clear_modified() << i;
		bufs [i].end_frame( clock_count );
	}
}